

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O1

int setup_imm_addr(gen_ctx *gen_ctx,uint64_t v,int *mod,int *rm,int64_t *disp32,int call_p,
                  MIR_item_t func_item)

{
  VARR_uint64_t *pVVar1;
  VARR_const_ref_t *pVVar2;
  long *plVar3;
  long lVar4;
  uint uVar5;
  size_t sVar6;
  uint64_t *puVar7;
  ulong uVar8;
  const_ref_t *pcVar9;
  void *pvVar10;
  uint extraout_EDX;
  const_ref_t *__ptr;
  int *__ptr_00;
  size_t __size;
  size_t sVar11;
  
  pVVar1 = gen_ctx->target_ctx->const_pool;
  if (pVVar1 == (VARR_uint64_t *)0x0) {
    setup_imm_addr_cold_4();
LAB_00175fae:
    __assert_fail("*mod < 0 && v >= 0 && v <= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0x878,"void setup_mod(int *, int)");
  }
  sVar11 = pVVar1->els_num;
  __ptr = (const_ref_t *)pVVar1->varr;
  if (sVar11 != 0) {
    sVar6 = 0;
    do {
      if (*(uint64_t *)(&__ptr->call_p + sVar6 * 2) == v) goto LAB_00175ea7;
      sVar6 = sVar6 + 1;
    } while (sVar11 != sVar6);
  }
  if (__ptr != (const_ref_t *)0x0) {
    uVar8 = sVar11 + 1;
    if (pVVar1->size < uVar8) {
      sVar6 = (uVar8 >> 1) + uVar8;
      puVar7 = (uint64_t *)realloc(__ptr,sVar6 * 8);
      pVVar1->varr = puVar7;
      pVVar1->size = sVar6;
    }
    sVar6 = pVVar1->els_num;
    pVVar1->els_num = sVar6 + 1;
    pVVar1->varr[sVar6] = v;
    sVar6 = sVar11;
LAB_00175ea7:
    if (((-1 < *mod) || (-1 < *rm)) || (-1 < *disp32)) {
      __assert_fail("*mod < 0 && *rm < 0 && *disp32 < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x886,"void setup_rip_rel_addr(MIR_disp_t, int *, int *, int64_t *)");
    }
    *rm = 5;
    if (-1 < *mod) goto LAB_00175fae;
    *mod = 0;
    *disp32 = 0;
    pVVar2 = gen_ctx->target_ctx->const_refs;
    __ptr = pVVar2->varr;
    if (__ptr == (const_ref_t *)0x0) {
      setup_imm_addr_cold_2();
    }
    else {
      uVar8 = pVVar2->els_num + 1;
      if (pVVar2->size < uVar8) {
        sVar11 = (uVar8 >> 1) + uVar8;
        pcVar9 = (const_ref_t *)realloc(__ptr,sVar11 * 0x28);
        pVVar2->varr = pcVar9;
        pVVar2->size = sVar11;
      }
      sVar11 = pVVar2->els_num;
      pcVar9 = pVVar2->varr;
      pVVar2->els_num = sVar11 + 1;
      pcVar9[sVar11].call_p = call_p;
      pcVar9[sVar11].func_item = func_item;
      pcVar9[sVar11].pc = 0;
      (&pcVar9[sVar11].pc)[1] = 0;
      pcVar9[sVar11].const_num = sVar6;
      pVVar2 = gen_ctx->target_ctx->const_refs;
      if (pVVar2 != (VARR_const_ref_t *)0x0) {
        return (int)pVVar2->els_num + -1;
      }
    }
    setup_imm_addr_cold_1();
  }
  setup_imm_addr_cold_3();
  plVar3 = *(long **)(__ptr[7].const_num + 0x30);
  __ptr_00 = (int *)plVar3[2];
  if (__ptr_00 != (int *)0x0) {
    uVar8 = *plVar3 + 1;
    if ((ulong)plVar3[1] < uVar8) {
      __size = (uVar8 >> 1) + uVar8;
      pvVar10 = realloc(__ptr_00,__size);
      plVar3[2] = (long)pvVar10;
      plVar3[1] = __size;
    }
    lVar4 = *plVar3;
    *plVar3 = lVar4 + 1;
    *(char *)(plVar3[2] + lVar4) = (char)gen_ctx;
    return (int)lVar4;
  }
  put_byte_cold_1();
  if (((__ptr_00 == (int *)0x0) || (*__ptr_00 < 0)) &&
     ((extraout_EDX < 0x22 && (*(int *)&gen_ctx->ctx < 0)))) {
    uVar5 = extraout_EDX - 0x10;
    if ((int)extraout_EDX < 0x10) {
      uVar5 = extraout_EDX;
    }
    if (7 < (int)uVar5) {
      if (__ptr_00 != (int *)0x0) {
        *__ptr_00 = 1;
      }
      uVar5 = uVar5 - 8;
    }
    *(uint *)&gen_ctx->ctx = uVar5;
    return uVar5;
  }
  __assert_fail("(rex == ((void*)0) || *rex < 0) && *r < 0 && v >= 0 && v <= ST1_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x85d,"void setup_r(int *, int *, int)");
}

Assistant:

static int setup_imm_addr (struct gen_ctx *gen_ctx, uint64_t v, int *mod, int *rm, int64_t *disp32,
                           int call_p, MIR_item_t func_item) {
  const_ref_t cr;
  size_t n;

  n = add_to_const_pool (gen_ctx, v);
  setup_rip_rel_addr (0, mod, rm, disp32);
  cr.call_p = call_p;
  cr.func_item = func_item;
  cr.pc = 0;
  cr.next_insn_disp = 0;
  cr.const_num = n;
  VARR_PUSH (const_ref_t, const_refs, cr);
  return (int) VARR_LENGTH (const_ref_t, const_refs) - 1;
}